

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::RenderArrowPointingAt
               (ImDrawList *draw_list,ImVec2 pos,ImVec2 half_sz,ImGuiDir direction,ImU32 col)

{
  float fVar1;
  ImVec2 local_18;
  ImVec2 local_10;
  ImVec2 local_8;
  
  fVar1 = half_sz.x;
  local_10.y = half_sz.y;
  local_18.x = pos.x;
  local_18.y = pos.y;
  switch(direction) {
  case 0:
    local_10.x = local_18.x + fVar1;
    local_8.y = local_18.y - local_10.y;
    local_10.y = local_10.y + local_18.y;
    local_8.x = local_10.x;
    break;
  case 1:
    local_10.x = local_18.x - fVar1;
    local_8.y = local_10.y + local_18.y;
    goto LAB_0014d41c;
  case 2:
    local_10.y = local_10.y + local_18.y;
    local_8.x = fVar1 + local_18.x;
    local_10.x = local_18.x - fVar1;
    local_8.y = local_10.y;
    break;
  case 3:
    local_8.y = local_18.y - local_10.y;
    local_10.x = local_18.x + fVar1;
LAB_0014d41c:
    local_8.x = local_18.x - fVar1;
    local_10.y = local_18.y - local_10.y;
    break;
  default:
    goto switchD_0014d33f_default;
  }
  local_18 = pos;
  ImDrawList::AddTriangleFilled(draw_list,&local_8,&local_10,&local_18,col);
switchD_0014d33f_default:
  return;
}

Assistant:

void ImGui::RenderArrowPointingAt(ImDrawList* draw_list, ImVec2 pos, ImVec2 half_sz, ImGuiDir direction, ImU32 col)
{
    switch (direction)
    {
    case ImGuiDir_Left:  draw_list->AddTriangleFilled(ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), ImVec2(pos.x + half_sz.x, pos.y + half_sz.y), pos, col); return;
    case ImGuiDir_Right: draw_list->AddTriangleFilled(ImVec2(pos.x - half_sz.x, pos.y + half_sz.y), ImVec2(pos.x - half_sz.x, pos.y - half_sz.y), pos, col); return;
    case ImGuiDir_Up:    draw_list->AddTriangleFilled(ImVec2(pos.x + half_sz.x, pos.y + half_sz.y), ImVec2(pos.x - half_sz.x, pos.y + half_sz.y), pos, col); return;
    case ImGuiDir_Down:  draw_list->AddTriangleFilled(ImVec2(pos.x - half_sz.x, pos.y - half_sz.y), ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), pos, col); return;
    case ImGuiDir_None: case ImGuiDir_COUNT: break; // Fix warnings
    }
}